

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * __thiscall
testing::internal::StreamingListener::UrlEncode_abi_cxx11_
          (string *__return_storage_ptr__,StreamingListener *this,char *str)

{
  int iVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  byte local_2d;
  char ch;
  undefined1 local_19;
  StreamingListener *local_18;
  char *str_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  str_local = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  strlen((char *)local_18);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_2d = *(byte *)&(local_18->super_EmptyTestEventListener).super_TestEventListener.
                       _vptr_TestEventListener;
  uVar2 = extraout_RDX;
  while (local_2d != 0) {
    iVar1 = (int)(char)local_2d;
    if (((iVar1 == 10) || (iVar1 - 0x25U < 2)) || (iVar1 == 0x3d)) {
      String::FormatByte_abi_cxx11_(&local_70,(String *)(ulong)local_2d,(uchar)uVar2);
      std::operator+(&local_50,"%",&local_70);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      uVar2 = extraout_RDX_00;
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar2 = extraout_RDX_01;
    }
    local_2d = *(byte *)((long)&(local_18->super_EmptyTestEventListener).super_TestEventListener.
                                _vptr_TestEventListener + 1);
    local_18 = (StreamingListener *)
               ((long)&(local_18->super_EmptyTestEventListener).super_TestEventListener.
                       _vptr_TestEventListener + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string StreamingListener::UrlEncode(const char* str) {
  string result;
  result.reserve(strlen(str) + 1);
  for (char ch = *str; ch != '\0'; ch = *++str) {
    switch (ch) {
      case '%':
      case '=':
      case '&':
      case '\n':
        result.append("%" + String::FormatByte(static_cast<unsigned char>(ch)));
        break;
      default:
        result.push_back(ch);
        break;
    }
  }
  return result;
}